

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                enet_uint32 incomingBandwidth,enet_uint32 outgoingBandwidth)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  enet_uint16 eVar3;
  ENetSocket socket;
  int iVar4;
  int iVar5;
  uint uVar6;
  ENetHost *pEVar7;
  ENetPeer *pEVar8;
  enet_uint64 eVar9;
  ENetPeer *pEVar10;
  size_t sVar11;
  ENetPeer *peer;
  
  if (peerCount < 0x1000) {
    pEVar7 = (ENetHost *)(*callbacks.malloc)(0x2b28);
    if (pEVar7 == (ENetHost *)0x0) {
      pEVar7 = (ENetHost *)(*callbacks.no_memory)();
      return pEVar7;
    }
    memset(pEVar7,0,0x2b28);
    pEVar8 = (ENetPeer *)(*callbacks.malloc)(peerCount * 0x1f8);
    if (pEVar8 == (ENetPeer *)0x0) {
      pEVar7 = (ENetHost *)(*callbacks.no_memory)();
      return pEVar7;
    }
    pEVar7->peers = pEVar8;
    memset(pEVar8,0,peerCount * 0x1f8);
    socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
    pEVar7->socket = socket;
    if (socket != -1) {
      enet_socket_set_option(socket,ENET_SOCKOPT_IPV6_V6ONLY,0);
      iVar5 = pEVar7->socket;
      if (iVar5 != -1) {
        if (address == (ENetAddress *)0x0) {
          enet_socket_set_option(iVar5,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_SNDBUF,0x40000);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_IPV6_V6ONLY,0);
LAB_00106a0e:
          sVar11 = 0xff;
          if (0xffffffffffffff00 < channelLimit - 0x100) {
            sVar11 = channelLimit;
          }
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pEVar7;
          pEVar7->randomSeed = SUB164(auVar1 % ZEXT816(0xffffffff),0);
          eVar9 = enet_host_random_seed();
          uVar6 = (int)eVar9 + pEVar7->randomSeed;
          pEVar7->randomSeed = uVar6 * 0x10000 | uVar6 >> 0x10;
          pEVar7->channelLimit = sVar11;
          pEVar7->incomingBandwidth = incomingBandwidth;
          pEVar7->outgoingBandwidth = outgoingBandwidth;
          pEVar7->bandwidthThrottleEpoch = 0;
          pEVar7->mtu = 0x570;
          pEVar7->recalculateBandwidthLimits = 0;
          pEVar7->peerCount = peerCount;
          pEVar7->commandCount = 0;
          pEVar7->bufferCount = 0;
          pEVar7->checksum = (ENetChecksumCallback)0x0;
          uVar2 = _setsockopt;
          *(undefined8 *)&(pEVar7->receivedAddress).host.__in6_u = _in6addr_any;
          *(undefined8 *)((long)&(pEVar7->receivedAddress).host.__in6_u + 8) = uVar2;
          (pEVar7->receivedAddress).port = 0;
          pEVar7->totalQueued = 0;
          pEVar7->receivedData = (enet_uint8 *)0x0;
          pEVar7->receivedDataLength = 0;
          pEVar7->totalSentData = 0;
          pEVar7->totalSentPackets = 0;
          pEVar7->totalReceivedData = 0;
          pEVar7->totalReceivedPackets = 0;
          pEVar7->connectedPeers = 0;
          pEVar7->bandwidthLimitedPeers = 0;
          pEVar7->duplicatePeers = 0xfff;
          pEVar7->maximumPacketSize = 0x2000000;
          pEVar7->maximumWaitingData = 0x2000000;
          pEVar7->intercept = (ENetInterceptCallback)0x0;
          (pEVar7->compressor).context = (void *)0x0;
          (pEVar7->compressor).compress =
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0;
          (pEVar7->compressor).decompress =
               (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0;
          (pEVar7->compressor).destroy = (_func_void_void_ptr *)0x0;
          (pEVar7->dispatchQueue).sentinel.next = &(pEVar7->dispatchQueue).sentinel;
          (pEVar7->dispatchQueue).sentinel.previous = &(pEVar7->dispatchQueue).sentinel;
          pEVar8 = pEVar7->peers;
          pEVar10 = pEVar8;
          for (peer = pEVar8; peer < pEVar8 + peerCount; peer = peer + 1) {
            peer->host = pEVar7;
            peer->incomingPeerID = (enet_uint16)(((long)pEVar10 - (long)pEVar8) / 0x1f8);
            peer->outgoingSessionID = 0xff;
            peer->incomingSessionID = 0xff;
            peer->data = (void *)0x0;
            (peer->acknowledgements).sentinel.next = &(peer->acknowledgements).sentinel;
            (peer->acknowledgements).sentinel.previous = &(peer->acknowledgements).sentinel;
            (peer->sentReliableCommands).sentinel.next = &(peer->sentReliableCommands).sentinel;
            (peer->sentReliableCommands).sentinel.previous = &(peer->sentReliableCommands).sentinel;
            (peer->outgoingCommands).sentinel.next = &(peer->outgoingCommands).sentinel;
            (peer->outgoingCommands).sentinel.previous = &(peer->outgoingCommands).sentinel;
            (peer->outgoingSendReliableCommands).sentinel.next =
                 &(peer->outgoingSendReliableCommands).sentinel;
            (peer->outgoingSendReliableCommands).sentinel.previous =
                 &(peer->outgoingSendReliableCommands).sentinel;
            (peer->dispatchedCommands).sentinel.next = &(peer->dispatchedCommands).sentinel;
            (peer->dispatchedCommands).sentinel.previous = &(peer->dispatchedCommands).sentinel;
            enet_peer_reset(peer);
            pEVar8 = pEVar7->peers;
            peerCount = pEVar7->peerCount;
            pEVar10 = pEVar10 + 1;
          }
          return pEVar7;
        }
        iVar4 = enet_socket_bind(iVar5,address);
        iVar5 = pEVar7->socket;
        if (-1 < iVar4) {
          enet_socket_set_option(iVar5,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_SNDBUF,0x40000);
          enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_IPV6_V6ONLY,0);
          iVar5 = enet_socket_get_address(pEVar7->socket,&pEVar7->address);
          if (iVar5 < 0) {
            eVar3 = address->sin6_scope_id;
            (pEVar7->address).port = address->port;
            (pEVar7->address).sin6_scope_id = eVar3;
            uVar2 = *(undefined8 *)((long)&(address->host).__in6_u + 8);
            *(undefined8 *)&(pEVar7->address).host.__in6_u = *(undefined8 *)&(address->host).__in6_u
            ;
            *(undefined8 *)((long)&(pEVar7->address).host.__in6_u + 8) = uVar2;
          }
          goto LAB_00106a0e;
        }
        if (iVar5 != -1) {
          enet_socket_destroy(iVar5);
        }
      }
    }
    (*callbacks.free)(pEVar7->peers);
    (*callbacks.free)(pEVar7);
  }
  return (ENetHost *)0x0;
}

Assistant:

ENetHost * enet_host_create(const ENetAddress *address, size_t peerCount, size_t channelLimit, enet_uint32 incomingBandwidth, enet_uint32 outgoingBandwidth) {
        ENetHost *host;
        ENetPeer *currentPeer;

        if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID) {
            return NULL;
        }

        host = (ENetHost *) enet_malloc(sizeof(ENetHost));
        if (host == NULL) { return NULL; }
        memset(host, 0, sizeof(ENetHost));

        host->peers = (ENetPeer *) enet_malloc(peerCount * sizeof(ENetPeer));
        if (host->peers == NULL) {
            enet_free(host);
            return NULL;
        }

        memset(host->peers, 0, peerCount * sizeof(ENetPeer));

        host->socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
        if (host->socket != ENET_SOCKET_NULL) {
            enet_socket_set_option (host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);
        }

        if (host->socket == ENET_SOCKET_NULL || (address != NULL && enet_socket_bind(host->socket, address) < 0)) {
            if (host->socket != ENET_SOCKET_NULL) {
                enet_socket_destroy(host->socket);
            }

            enet_free(host->peers);
            enet_free(host);

            return NULL;
        }

        enet_socket_set_option(host->socket, ENET_SOCKOPT_NONBLOCK, 1);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_BROADCAST, 1);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_RCVBUF, ENET_HOST_RECEIVE_BUFFER_SIZE);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_SNDBUF, ENET_HOST_SEND_BUFFER_SIZE);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);

        if (address != NULL && enet_socket_get_address(host->socket, &host->address) < 0) {
            host->address = *address;
        }

        if (!channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT) {
            channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
        }

        host->randomSeed                    = (enet_uint32) ((uintptr_t) host % UINT32_MAX);
        host->randomSeed                    += enet_host_random_seed();
        host->randomSeed                    = (host->randomSeed << 16) | (host->randomSeed >> 16);
        host->channelLimit                  = channelLimit;
        host->incomingBandwidth             = incomingBandwidth;
        host->outgoingBandwidth             = outgoingBandwidth;
        host->bandwidthThrottleEpoch        = 0;
        host->recalculateBandwidthLimits    = 0;
        host->mtu                           = ENET_HOST_DEFAULT_MTU;
        host->peerCount                     = peerCount;
        host->commandCount                  = 0;
        host->bufferCount                   = 0;
        host->checksum                      = NULL;
        host->receivedAddress.host          = ENET_HOST_ANY;
        host->receivedAddress.port          = 0;
        host->receivedData                  = NULL;
        host->receivedDataLength            = 0;
        host->totalSentData                 = 0;
        host->totalSentPackets              = 0;
        host->totalReceivedData             = 0;
        host->totalReceivedPackets          = 0;
        host->totalQueued                   = 0;
        host->connectedPeers                = 0;
        host->bandwidthLimitedPeers         = 0;
        host->duplicatePeers                = ENET_PROTOCOL_MAXIMUM_PEER_ID;
        host->maximumPacketSize             = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
        host->maximumWaitingData            = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;
        host->compressor.context            = NULL;
        host->compressor.compress           = NULL;
        host->compressor.decompress         = NULL;
        host->compressor.destroy            = NULL;
        host->intercept                     = NULL;

        enet_list_clear(&host->dispatchQueue);

        for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
            currentPeer->host = host;
            currentPeer->incomingPeerID    = currentPeer - host->peers;
            currentPeer->outgoingSessionID = currentPeer->incomingSessionID = 0xFF;
            currentPeer->data = NULL;

            enet_list_clear(&currentPeer->acknowledgements);
            enet_list_clear(&currentPeer->sentReliableCommands);
            enet_list_clear(&currentPeer->outgoingCommands);
            enet_list_clear(&currentPeer->outgoingSendReliableCommands);
            enet_list_clear(&currentPeer->dispatchedCommands);

            enet_peer_reset(currentPeer);
        }

        return host;
    }